

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O0

void __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
::CheckBufferPermissions
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
           *this,TEmitBufferAllocation *allocation)

{
  code *pcVar1;
  bool bVar2;
  SIZE_T SVar3;
  undefined4 *puVar4;
  SIZE_T result;
  SIZE_T size;
  BYTE *buffer;
  MEMORY_BASIC_INFORMATION memInfo;
  AutoRealOrFakeCriticalSection<FakeCriticalSection> local_20;
  AutoRealOrFakeCriticalSection<FakeCriticalSection> autoCs;
  TEmitBufferAllocation *allocation_local;
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
  *this_local;
  
  autoCs.cs = (FakeCriticalSection *)allocation;
  AutoRealOrFakeCriticalSection<FakeCriticalSection>::AutoRealOrFakeCriticalSection
            (&local_20,&this->criticalSection);
  if (*(long *)(autoCs.cs + 4) == 0) {
    memInfo._44_4_ = 1;
  }
  else {
    size = *(SIZE_T *)(*(long *)autoCs.cs + 0x18);
    result = *(SIZE_T *)(autoCs.cs + 4);
    do {
      SVar3 = VirtualQuery((LPCVOID)size,(PMEMORY_BASIC_INFORMATION)&buffer,0x30);
      if (SVar3 == 0) goto LAB_00516969;
      if (memInfo.RegionSize._4_4_ == 0x40) {
        Output::Print(L"ERROR: Found PAGE_EXECUTE_READWRITE page!\n");
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                           ,600,"(0)","Page was marked PAGE_EXECUTE_READWRITE");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      if (result <= (ulong)memInfo._16_8_) goto LAB_00516969;
      size = memInfo._16_8_ + size;
      result = result - memInfo._16_8_;
    } while (result != 0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x26b,"(0)","Last VirtualQuery left us with unmatched regions");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
LAB_00516969:
    memInfo._44_4_ = 0;
  }
  AutoRealOrFakeCriticalSection<FakeCriticalSection>::~AutoRealOrFakeCriticalSection(&local_20);
  return;
}

Assistant:

void
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::CheckBufferPermissions(TEmitBufferAllocation *allocation)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

    if(allocation->bytesCommitted == 0)
        return;

    MEMORY_BASIC_INFORMATION memInfo;

    BYTE *buffer = (BYTE*) allocation->allocation->address;
    SIZE_T size = allocation->bytesCommitted;

    while(1)
    {
        SIZE_T result = VirtualQuery(buffer, &memInfo, sizeof(memInfo));
        if(result == 0)
        {
            // VirtualQuery failed.  This is not an expected condition, but it would be benign for the purposes of this check.  Seems
            // to occur occasionally on process shutdown.
            break;
        }
        else if(memInfo.Protect == PAGE_EXECUTE_READWRITE)
        {
            Output::Print(_u("ERROR: Found PAGE_EXECUTE_READWRITE page!\n"));
#ifdef DEBUG
            AssertMsg(FALSE, "Page was marked PAGE_EXECUTE_READWRITE");
#else
            Fatal();
#endif
        }

        // Figure out if we need to continue the query.  The returned size might be larger than the size we requested,
        // for instance if more pages were allocated directly afterward, with the same permissions.
        if(memInfo.RegionSize >= size)
        {
            break;
        }

        // recalculate size for next iteration
        buffer += memInfo.RegionSize;
        size -= memInfo.RegionSize;

        if(size <= 0)
        {
            AssertMsg(FALSE, "Last VirtualQuery left us with unmatched regions");
            break;
        }
    }
}